

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *p)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_3c4;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  Printer *p_local;
  _Any_data local_3b8;
  code *local_3a8;
  code *pcStack_3a0;
  undefined1 *local_398;
  undefined8 local_390;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368 [8];
  undefined8 uStack_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  char *local_338;
  string local_330;
  Sub local_310;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    if ((this->descriptor_->options_->field_0)._impl_.message_set_wire_format_ == true) {
      io::Printer::Emit(p,0x39e,
                        "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n        const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n        const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n        $annotate_serialize$ target =\n            this_.$extensions$\n                .InternalSerializeMessageSetWithCachedSizesToArray(\n                    &default_instance(), target, stream);\n        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(\n            this_.$unknown_fields$, target, stream);\n        return target;\n      }\n    "
                       );
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"debug_cond",&local_3c1)
    ;
    local_338 = "1";
    io::Printer::Sub::Sub<char_const*>(&local_310,&local_330,&local_338);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"ndebug",&local_3c2);
    local_258 = local_248;
    if (local_358 == local_348) {
      uStack_240 = uStack_340;
    }
    else {
      local_258 = local_358;
    }
    local_250 = local_350;
    local_350 = 0;
    local_348[0] = 0;
    local_3a8 = (code *)0x0;
    pcStack_3a0 = (code *)0x0;
    local_3b8._M_unused._M_object = (void *)0x0;
    local_3b8._8_8_ = 0;
    local_358 = local_348;
    local_3b8._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_3b8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_3b8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_3a0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_3a8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_238,(function<bool_()> *)&local_3b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = 0;
    local_1f0 = 0;
    if (local_218 == '\x01') {
      std::__cxx11::string::assign((char *)&local_210);
    }
    local_1a8 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"debug",&local_3c3);
    local_1a0 = local_190;
    if (local_378 == local_368) {
      uStack_188 = uStack_360;
    }
    else {
      local_1a0 = local_378;
    }
    local_198 = local_370;
    local_370 = 0;
    local_368[0] = 0;
    local_3a8 = (code *)0x0;
    pcStack_3a0 = (code *)0x0;
    local_3b8._M_unused._M_object = (void *)0x0;
    local_3b8._8_8_ = 0;
    local_378 = local_368;
    local_3b8._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_3b8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_3b8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_3a0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_3a8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_180,(function<bool_()> *)&local_3b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"ifdef",&local_3c4);
    local_e8 = local_d8;
    if (local_398 == local_388) {
      uStack_d0 = uStack_380;
    }
    else {
      local_e8 = local_398;
    }
    local_e0 = local_390;
    local_390 = 0;
    local_388[0] = 0;
    local_3a8 = (code *)0x0;
    pcStack_3a0 = (code *)0x0;
    local_3b8._M_unused._M_object = (void *)0x0;
    local_3b8._8_8_ = 0;
    local_398 = local_388;
    local_3b8._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_3b8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_3b8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_3a0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_3a8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_3b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    io::Printer::Emit(p,&local_310,4,0x33c,
                      "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n          const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n          const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n          $annotate_serialize$;\n          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n          $ifdef$;\n          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n          return target;\n        }\n      "
                     );
    lVar2 = 0x228;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_310.key_._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0xb8;
    } while (lVar2 != -0xb8);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_330);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeWithCachedSizesToArray(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    p->Emit(R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
        const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
        const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
        $annotate_serialize$ target =
            this_.$extensions$
                .InternalSerializeMessageSetWithCachedSizesToArray(
                    &default_instance(), target, stream);
        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
            this_.$unknown_fields$, target, stream);
        return target;
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"debug_cond", ShouldSerializeInOrder(descriptor_, options_)
                             ? "1"
                             : "defined(NDEBUG)"},
          {"ndebug", [&] { GenerateSerializeWithCachedSizesBody(p); }},
          {"debug", [&] { GenerateSerializeWithCachedSizesBodyShuffled(p); }},
          {"ifdef",
           [&] {
             if (ShouldSerializeInOrder(descriptor_, options_)) {
               p->Emit("$ndebug$");
             } else {
               p->Emit(R"cc(
#ifdef NDEBUG
                 $ndebug$;
#else   // NDEBUG
                 $debug$;
#endif  // !NDEBUG
               )cc");
             }
           }},
      },
      R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
          const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
          const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          $annotate_serialize$;
          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)
          $ifdef$;
          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)
          return target;
        }
      )cc");
}